

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  wchar_t wVar1;
  float fVar2;
  int iVar3;
  ImDrawChannel *pIVar4;
  ImDrawCmd *pIVar5;
  uint local_8c;
  ImDrawCmd *local_88;
  ImDrawCmd *curr_cmd;
  int sz_1;
  int sz;
  ImDrawChannel *ch_1;
  ImWchar *pIStack_58;
  int i_1;
  ImDrawIdx *idx_write;
  ImDrawCmd *cmd_write;
  int cmd_n;
  ImDrawCmd *next_cmd;
  ImDrawChannel *ch;
  int i;
  int idx_offset;
  ImDrawCmd *last_cmd;
  int new_idx_buffer_count;
  int new_cmd_buffer_count;
  ImDrawList *draw_list_local;
  ImDrawListSplitter *this_local;
  
  if (1 < this->_Count) {
    SetCurrentChannel(this,draw_list,0);
    ImDrawList::_PopUnusedDrawCmd(draw_list);
    last_cmd._4_4_ = 0;
    last_cmd._0_4_ = 0;
    if ((this->_Count < 1) || ((draw_list->CmdBuffer).Size < 1)) {
      local_88 = (ImDrawCmd *)0x0;
    }
    else {
      local_88 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer);
    }
    _i = local_88;
    if (local_88 == (ImDrawCmd *)0x0) {
      local_8c = 0;
    }
    else {
      local_8c = local_88->IdxOffset + local_88->ElemCount;
    }
    ch._4_4_ = local_8c;
    for (ch._0_4_ = 1; (int)ch < this->_Count; ch._0_4_ = (int)ch + 1) {
      pIVar4 = ImVector<ImDrawChannel>::operator[]
                         ((ImVector<ImDrawChannel> *)&this->_Channels,(int)ch);
      if ((L'\0' < (pIVar4->_CmdBuffer).Size) &&
         (pIVar5 = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)pIVar4), pIVar5->ElemCount == 0)
         ) {
        ImVector<ImDrawCmd>::pop_back((ImVector<ImDrawCmd> *)pIVar4);
      }
      if ((L'\0' < (pIVar4->_CmdBuffer).Size) && (_i != (ImDrawCmd *)0x0)) {
        pIVar5 = ImVector<ImDrawCmd>::operator[]((ImVector<ImDrawCmd> *)pIVar4,0);
        iVar3 = memcmp(_i,pIVar5,0x1c);
        if ((iVar3 == 0) &&
           ((_i->UserCallback == (ImDrawCallback)0x0 &&
            (pIVar5->UserCallback == (ImDrawCallback)0x0)))) {
          _i->ElemCount = pIVar5->ElemCount + _i->ElemCount;
          ch._4_4_ = pIVar5->ElemCount + ch._4_4_;
          ImVector<ImDrawCmd>::erase((ImVector<ImDrawCmd> *)pIVar4,(pIVar4->_CmdBuffer).Data);
        }
      }
      if (L'\0' < (pIVar4->_CmdBuffer).Size) {
        _i = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)pIVar4);
      }
      last_cmd._4_4_ = (pIVar4->_CmdBuffer).Size + last_cmd._4_4_;
      last_cmd._0_4_ = (pIVar4->_IdxBuffer).Size + (int)last_cmd;
      for (cmd_write._4_4_ = L'\0'; cmd_write._4_4_ < (pIVar4->_CmdBuffer).Size;
          cmd_write._4_4_ = cmd_write._4_4_ + L'\x01') {
        (pIVar4->_CmdBuffer).Data[cmd_write._4_4_].IdxOffset = ch._4_4_;
        ch._4_4_ = (pIVar4->_CmdBuffer).Data[cmd_write._4_4_].ElemCount + ch._4_4_;
      }
    }
    ImVector<ImDrawCmd>::resize(&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + last_cmd._4_4_);
    ImVector<unsigned_short>::resize
              ((ImVector<unsigned_short> *)&draw_list->IdxBuffer,
               (draw_list->IdxBuffer).Size + (int)last_cmd);
    idx_write = (ImDrawIdx *)
                ((draw_list->CmdBuffer).Data +
                ((long)(draw_list->CmdBuffer).Size - (long)last_cmd._4_4_));
    pIStack_58 = (draw_list->IdxBuffer).Data +
                 ((long)(draw_list->IdxBuffer).Size - (long)(int)last_cmd);
    for (ch_1._4_4_ = 1; ch_1._4_4_ < this->_Count; ch_1._4_4_ = ch_1._4_4_ + 1) {
      pIVar4 = ImVector<ImDrawChannel>::operator[]
                         ((ImVector<ImDrawChannel> *)&this->_Channels,ch_1._4_4_);
      wVar1 = (pIVar4->_CmdBuffer).Size;
      if (wVar1 != L'\0') {
        memcpy(idx_write,(pIVar4->_CmdBuffer).Data,(long)wVar1 * 0x38);
        idx_write = idx_write + (long)wVar1 * 0x1c;
      }
      wVar1 = (pIVar4->_IdxBuffer).Size;
      if (wVar1 != L'\0') {
        memcpy(pIStack_58,(pIVar4->_IdxBuffer).Data,(long)wVar1 << 1);
        pIStack_58 = pIStack_58 + wVar1;
      }
    }
    draw_list->_IdxWritePtr = pIStack_58;
    if (((draw_list->CmdBuffer).Size == 0) ||
       (pIVar5 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer),
       pIVar5->UserCallback != (ImDrawCallback)0x0)) {
      ImDrawList::AddDrawCmd(draw_list);
    }
    pIVar5 = (draw_list->CmdBuffer).Data + ((draw_list->CmdBuffer).Size + -1);
    if (pIVar5->ElemCount == 0) {
      fVar2 = (draw_list->_CmdHeader).ClipRect.y;
      (pIVar5->ClipRect).x = (draw_list->_CmdHeader).ClipRect.x;
      (pIVar5->ClipRect).y = fVar2;
      fVar2 = (draw_list->_CmdHeader).ClipRect.w;
      (pIVar5->ClipRect).z = (draw_list->_CmdHeader).ClipRect.z;
      (pIVar5->ClipRect).w = fVar2;
      pIVar5->TextureId = (draw_list->_CmdHeader).TextureId;
      pIVar5->VtxOffset = (draw_list->_CmdHeader).VtxOffset;
    }
    else {
      iVar3 = memcmp(pIVar5,&draw_list->_CmdHeader,0x1c);
      if (iVar3 != 0) {
        ImDrawList::AddDrawCmd(draw_list);
      }
    }
    this->_Count = 1;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}